

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O0

DSVectorBase<double> * __thiscall
soplex::DSVectorBase<double>::operator=(DSVectorBase<double> *this,VectorBase<double> *vec)

{
  DSVectorBase<double> *in_RDI;
  DSVectorBase<double> *unaff_retaddr;
  DSVectorBase<double> *pDVar1;
  int newmax;
  
  pDVar1 = in_RDI;
  SVectorBase<double>::clear((SVectorBase<double> *)0x26fcd0);
  newmax = (int)((ulong)pDVar1 >> 0x20);
  VectorBase<double>::dim((VectorBase<double> *)0x26fcda);
  setMax(unaff_retaddr,newmax);
  SVectorBase<double>::operator=((SVectorBase<double> *)this,vec);
  return in_RDI;
}

Assistant:

inline
DSVectorBase<R>& DSVectorBase<R>::operator=(const VectorBase<S>& vec)
{
   assert(this != (const DSVectorBase<R>*)(&vec));

   SVectorBase<R>::clear();
   setMax(vec.dim());
   SVectorBase<R>::operator=(vec);

   assert(isConsistent());

   return *this;
}